

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::constant_expression_abi_cxx11_
          (CompilerGLSL *this,SPIRConstant *c,bool inside_block_like_struct_scope,
          bool inside_struct_scope)

{
  SPIRConstantOp *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  SPIRUndef *pSVar5;
  SPIRConstantOp *pSVar6;
  size_t sVar7;
  undefined7 in_register_00000011;
  char *pcVar8;
  byte in_R8B;
  byte local_721;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708 [32];
  spirv_cross local_6e8 [32];
  undefined1 local_6c8 [8];
  SPIRType tmp_type_2;
  string local_558 [36];
  uint local_534;
  string local_530 [4];
  uint32_t col;
  undefined1 local_509;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508 [32];
  spirv_cross local_4e8 [32];
  undefined1 local_4c8 [8];
  SPIRType tmp_type_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370 [39];
  allocator local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [39];
  allocator local_321;
  undefined1 local_320 [72];
  SPIRConstant *local_2d8;
  SPIRConstant *subc;
  string local_2b0 [32];
  SPIRConstantOp *local_290;
  SPIRConstantOp *op;
  TypedID<(spirv_cross::Types)3> *elem;
  TypedID<(spirv_cross::Types)3> *__end3;
  TypedID<(spirv_cross::Types)3> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *__range3;
  undefined1 local_260 [4];
  uint32_t subconstant_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  undefined1 local_220 [64];
  undefined1 local_1e0 [8];
  SPIRType tmp_type;
  SPIRType *p_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [35];
  byte local_45;
  bool needs_trailing_tracket;
  byte local_32;
  char local_31;
  bool array_type_decays;
  SPIRType *pSStack_30;
  SPIRType *type;
  bool inside_struct_scope_local;
  SPIRConstant *pSStack_20;
  bool inside_block_like_struct_scope_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  pSStack_20 = (SPIRConstant *)CONCAT71(in_register_00000011,inside_block_like_struct_scope);
  type._6_1_ = in_R8B & 1;
  type._7_1_ = inside_struct_scope;
  c_local = c;
  this_local = this;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).field_0xc)
  ;
  pSStack_30 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar3);
  bVar2 = Compiler::type_is_top_level_pointer((Compiler *)c,pSStack_30);
  if (bVar2) {
    ::std::__cxx11::string::string((string *)this,(string *)&c[0x16].field_0x150);
  }
  else {
    bVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::empty
                      (&(pSStack_20->subconstants).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>);
    if (bVar2) {
      if ((*(int *)&(pSStack_30->super_IVariant).field_0xc == 0xf) &&
         (sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(pSStack_30->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
         sVar7 == 0)) {
        if ((c[0x17].m.c[1].id[3].id & 0x100) == 0) {
          if ((c[0x17].m.c[1].id[0].id & 0x100) == 0) {
            if ((c[0x17].m.c[1].id[0].id & 1) == 0) {
              (*(c->super_IVariant)._vptr_IVariant[0x13])(local_370,c,pSStack_30,0);
              join<std::__cxx11::string,char_const(&)[4]>
                        ((spirv_cross *)this,local_370,(char (*) [4])0x5e427c);
              ::std::__cxx11::string::~string((string *)local_370);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)this,"{ 0 }",&local_349);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_349);
            }
          }
          else {
            (*(c->super_IVariant)._vptr_IVariant[0x13])(local_348,c,pSStack_30,0);
            join<std::__cxx11::string,char_const(&)[6]>
                      ((spirv_cross *)this,local_348,(char (*) [6])"{ 0 }");
            ::std::__cxx11::string::~string((string *)local_348);
          }
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"{ }",&local_321);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
        }
      }
      else {
        uVar3 = SPIRConstant::columns(pSStack_20);
        if (uVar3 == 1) {
          tmp_type_1.member_name_cache._M_h._M_single_bucket._7_1_ = 0;
          (*(c->super_IVariant)._vptr_IVariant[0x19])(this,c,pSStack_20,0);
          if ((((type._6_1_ & 1) != 0) && (c[0x17].m.c[1].r[3].u32 != 2)) &&
             (*(int *)&(pSStack_30->super_IVariant).field_0xc == 2)) {
            SPIRType::SPIRType((SPIRType *)local_4c8,pSStack_30);
            tmp_type_1.super_IVariant._vptr_IVariant._4_4_ = c[0x17].m.c[1].r[3].u32;
            (*(c->super_IVariant)._vptr_IVariant[0x13])(local_508,c,local_4c8,0);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (local_4e8,local_508,(char (*) [2])0x601bd3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char (*) [2])0x5eaa1a);
            ::std::__cxx11::string::operator=((string *)this,(string *)local_4e8);
            ::std::__cxx11::string::~string((string *)local_4e8);
            ::std::__cxx11::string::~string((string *)local_508);
            SPIRType::~SPIRType((SPIRType *)local_4c8);
          }
        }
        else {
          local_509 = 0;
          (*(c->super_IVariant)._vptr_IVariant[0x13])(local_530,c,pSStack_30,0);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                           ,(char *)local_530);
          ::std::__cxx11::string::~string(local_530);
          for (local_534 = 0; uVar4 = local_534, uVar3 = SPIRConstant::columns(pSStack_20),
              uVar4 < uVar3; local_534 = local_534 + 1) {
            uVar3 = SPIRConstant::specialization_constant_id(pSStack_20,local_534);
            if (uVar3 == 0) {
              (*(c->super_IVariant)._vptr_IVariant[0x19])
                        (&tmp_type_2.member_name_cache._M_h._M_single_bucket,c,pSStack_20,
                         (ulong)local_534);
              ::std::__cxx11::string::operator+=
                        ((string *)this,
                         (string *)&tmp_type_2.member_name_cache._M_h._M_single_bucket);
              ::std::__cxx11::string::~string
                        ((string *)&tmp_type_2.member_name_cache._M_h._M_single_bucket);
            }
            else {
              uVar3 = SPIRConstant::specialization_constant_id(pSStack_20,local_534);
              (*(c->super_IVariant)._vptr_IVariant[6])(local_558,c,(ulong)uVar3,1);
              ::std::__cxx11::string::operator+=((string *)this,local_558);
              ::std::__cxx11::string::~string(local_558);
            }
            uVar4 = local_534 + 1;
            uVar3 = SPIRConstant::columns(pSStack_20);
            if (uVar4 < uVar3) {
              ::std::__cxx11::string::operator+=((string *)this,", ");
            }
          }
          ::std::__cxx11::string::operator+=((string *)this,")");
          if ((((type._6_1_ & 1) != 0) && (c[0x17].m.c[1].r[3].u32 != 2)) &&
             (*(int *)&(pSStack_30->super_IVariant).field_0xc == 2)) {
            SPIRType::SPIRType((SPIRType *)local_6c8,pSStack_30);
            tmp_type_2.super_IVariant._vptr_IVariant._4_4_ = c[0x17].m.c[1].r[3].u32;
            (*(c->super_IVariant)._vptr_IVariant[0x13])(local_708,c,local_6c8,0);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (local_6e8,local_708,(char (*) [2])0x601bd3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char (*) [2])0x5eaa1a);
            ::std::__cxx11::string::operator=((string *)this,(string *)local_6e8);
            ::std::__cxx11::string::~string((string *)local_6e8);
            ::std::__cxx11::string::~string((string *)local_708);
            SPIRType::~SPIRType((SPIRType *)local_6c8);
          }
        }
      }
    }
    else {
      local_31 = '\0';
      ::std::__cxx11::string::string((string *)this);
      local_721 = 0;
      if ((type._7_1_ & 1) != 0) {
        bVar2 = Compiler::type_is_top_level_array((Compiler *)c,pSStack_30);
        local_721 = 0;
        if (bVar2) {
          local_721 = *(byte *)((long)&c[0x17].m.c[1].id[3].id + 3) ^ 0xff;
        }
      }
      local_32 = local_721 & 1;
      local_45 = 0;
      if ((((c[0x17].m.c[1].id[0].id & 1) == 0) || ((c[0x17].m.c[1].id[0].id & 0x100) == 0)) ||
         ((*(int *)&(pSStack_30->super_IVariant).field_0xc != 0xf ||
          (bVar2 = Compiler::type_is_top_level_array((Compiler *)c,pSStack_30), bVar2)))) {
        if (((((c[0x17].m.c[1].id[0].id & 1) == 0) || ((c[0x17].m.c[1].id[0].id & 0x100) == 0)) ||
            ((c[0x17].m.c[1].id[3].id & 0x10000) == 0)) ||
           ((bVar2 = Compiler::type_is_top_level_array((Compiler *)c,pSStack_30), !bVar2 ||
            ((local_32 & 1) != 0)))) {
          if ((c[0x17].m.c[1].id[0].id & 1) == 0) {
            type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_260,(SPIRType *)c);
            ::std::operator+(local_240,local_260);
            ::std::__cxx11::string::operator=((string *)this,(string *)local_240);
            ::std::__cxx11::string::~string((string *)local_240);
            ::std::__cxx11::string::~string((string *)local_260);
          }
          else {
            ::std::__cxx11::string::operator=((string *)this,"{ ");
          }
        }
        else {
          tmp_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)pSStack_30;
          SPIRType::SPIRType((SPIRType *)local_1e0);
          if ((((type._6_1_ & 1) != 0) && (c[0x17].m.c[1].r[3].u32 != 2)) &&
             (*(int *)&(pSStack_30->super_IVariant).field_0xc == 2)) {
            SPIRType::operator=((SPIRType *)local_1e0,pSStack_30);
            tmp_type.super_IVariant._vptr_IVariant._4_4_ = c[0x17].m.c[1].r[3].u32;
            tmp_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)local_1e0;
          }
          type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_220,(SPIRType *)c);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_220 + 0x20),local_220);
          ::std::__cxx11::string::operator=((string *)this,(string *)(local_220 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_220 + 0x20));
          ::std::__cxx11::string::~string((string *)local_220);
          local_45 = 1;
          SPIRType::~SPIRType((SPIRType *)local_1e0);
        }
      }
      else {
        type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)&p_type,(SPIRType *)c);
        ::std::operator+(local_68,(char *)&p_type);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_68);
        ::std::__cxx11::string::~string((string *)local_68);
        ::std::__cxx11::string::~string((string *)&p_type);
      }
      __range3._4_4_ = 0;
      __begin3 = (TypedID<(spirv_cross::Types)3> *)&pSStack_20->subconstants;
      __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)__begin3);
      elem = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::end
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)__begin3);
      for (; __end3 != elem; __end3 = __end3 + 1) {
        op = (SPIRConstantOp *)__end3;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3);
        local_290 = Compiler::maybe_get<spirv_cross::SPIRConstantOp>((Compiler *)c,uVar3);
        if (local_290 == (SPIRConstantOp *)0x0) {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
          pSVar5 = Compiler::maybe_get<spirv_cross::SPIRUndef>((Compiler *)c,uVar3);
          if (pSVar5 == (SPIRUndef *)0x0) {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
            local_2d8 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)c,uVar3);
            if ((local_2d8->specialization & 1U) != 0) {
              uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
              bVar2 = expression_is_forwarded((CompilerGLSL *)c,uVar3);
              if (!bVar2) {
                uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
                (*(c->super_IVariant)._vptr_IVariant[6])(local_320 + 0x28,c,(ulong)uVar3,1);
                ::std::__cxx11::string::operator+=((string *)this,(string *)(local_320 + 0x28));
                ::std::__cxx11::string::~string((string *)(local_320 + 0x28));
                goto LAB_0035b3ae;
              }
            }
            bVar2 = Compiler::type_is_top_level_array((Compiler *)c,pSStack_30);
            if ((!bVar2) && (*(int *)&(pSStack_30->super_IVariant).field_0xc == 0xf)) {
              local_320._36_4_ =
                   TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_30->super_IVariant).self);
              type._7_1_ = Compiler::has_member_decoration
                                     ((Compiler *)c,(TypeID)local_320._36_4_,__range3._4_4_,
                                      DecorationOffset);
            }
            if (*(int *)&(pSStack_30->super_IVariant).field_0xc == 0xf) {
              type._6_1_ = 1;
            }
            constant_expression_abi_cxx11_
                      ((CompilerGLSL *)local_320,c,SUB81(local_2d8,0),(bool)(type._7_1_ & 1));
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_320);
            ::std::__cxx11::string::~string((string *)local_320);
          }
          else {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
            (*(c->super_IVariant)._vptr_IVariant[6])(&subc,c,(ulong)uVar3,1);
            ::std::__cxx11::string::operator+=((string *)this,(string *)&subc);
            ::std::__cxx11::string::~string((string *)&subc);
          }
        }
        else {
          (*(c->super_IVariant)._vptr_IVariant[0x18])(local_2b0,c,local_290);
          ::std::__cxx11::string::operator+=((string *)this,local_2b0);
          ::std::__cxx11::string::~string(local_2b0);
        }
LAB_0035b3ae:
        pSVar1 = op;
        pSVar6 = (SPIRConstantOp *)
                 VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::back
                           (&(pSStack_20->subconstants).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>);
        if (pSVar1 != pSVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
        __range3._4_4_ = __range3._4_4_ + 1;
      }
      pcVar8 = ")";
      if ((c[0x17].m.c[1].id[0].id & 1) != 0) {
        pcVar8 = " }";
      }
      ::std::__cxx11::string::operator+=((string *)this,pcVar8);
      if ((local_45 & 1) != 0) {
        ::std::__cxx11::string::operator+=((string *)this,")");
      }
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::constant_expression(const SPIRConstant &c,
                                         bool inside_block_like_struct_scope,
                                         bool inside_struct_scope)
{
	auto &type = get<SPIRType>(c.constant_type);

	if (type_is_top_level_pointer(type))
	{
		return backend.null_pointer_literal;
	}
	else if (!c.subconstants.empty())
	{
		// Handles Arrays and structures.
		string res;

		// Only consider the decay if we are inside a struct scope where we are emitting a member with Offset decoration.
		// Outside a block-like struct declaration, we can always bind to a constant array with templated type.
		// Should look at ArrayStride here as well, but it's possible to declare a constant struct
		// with Offset = 0, using no ArrayStride on the enclosed array type.
		// A particular CTS test hits this scenario.
		bool array_type_decays = inside_block_like_struct_scope &&
		                         type_is_top_level_array(type) &&
		                         !backend.array_is_value_type_in_buffer_blocks;

		// Allow Metal to use the array<T> template to make arrays a value type
		bool needs_trailing_tracket = false;
		if (backend.use_initializer_list && backend.use_typed_initializer_list && type.basetype == SPIRType::Struct &&
		    !type_is_top_level_array(type))
		{
			res = type_to_glsl_constructor(type) + "{ ";
		}
		else if (backend.use_initializer_list && backend.use_typed_initializer_list && backend.array_is_value_type &&
		         type_is_top_level_array(type) && !array_type_decays)
		{
			const auto *p_type = &type;
			SPIRType tmp_type;

			if (inside_struct_scope &&
			    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
			    type.basetype == SPIRType::Boolean)
			{
				tmp_type = type;
				tmp_type.basetype = backend.boolean_in_struct_remapped_type;
				p_type = &tmp_type;
			}

			res = type_to_glsl_constructor(*p_type) + "({ ";
			needs_trailing_tracket = true;
		}
		else if (backend.use_initializer_list)
		{
			res = "{ ";
		}
		else
		{
			res = type_to_glsl_constructor(type) + "(";
		}

		uint32_t subconstant_index = 0;
		for (auto &elem : c.subconstants)
		{
			if (auto *op = maybe_get<SPIRConstantOp>(elem))
			{
				res += constant_op_expression(*op);
			}
			else if (maybe_get<SPIRUndef>(elem) != nullptr)
			{
				res += to_name(elem);
			}
			else
			{
				auto &subc = get<SPIRConstant>(elem);
				if (subc.specialization && !expression_is_forwarded(elem))
					res += to_name(elem);
				else
				{
					if (!type_is_top_level_array(type) && type.basetype == SPIRType::Struct)
					{
						// When we get down to emitting struct members, override the block-like information.
						// For constants, we can freely mix and match block-like state.
						inside_block_like_struct_scope =
						    has_member_decoration(type.self, subconstant_index, DecorationOffset);
					}

					if (type.basetype == SPIRType::Struct)
						inside_struct_scope = true;

					res += constant_expression(subc, inside_block_like_struct_scope, inside_struct_scope);
				}
			}

			if (&elem != &c.subconstants.back())
				res += ", ";

			subconstant_index++;
		}

		res += backend.use_initializer_list ? " }" : ")";
		if (needs_trailing_tracket)
			res += ")";

		return res;
	}
	else if (type.basetype == SPIRType::Struct && type.member_types.size() == 0)
	{
		// Metal tessellation likes empty structs which are then constant expressions.
		if (backend.supports_empty_struct)
			return "{ }";
		else if (backend.use_typed_initializer_list)
			return join(type_to_glsl(type), "{ 0 }");
		else if (backend.use_initializer_list)
			return "{ 0 }";
		else
			return join(type_to_glsl(type), "(0)");
	}
	else if (c.columns() == 1)
	{
		auto res = constant_expression_vector(c, 0);

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
	else
	{
		string res = type_to_glsl(type) + "(";
		for (uint32_t col = 0; col < c.columns(); col++)
		{
			if (c.specialization_constant_id(col) != 0)
				res += to_name(c.specialization_constant_id(col));
			else
				res += constant_expression_vector(c, col);

			if (col + 1 < c.columns())
				res += ", ";
		}
		res += ")";

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
}